

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHPublicName_Test::TestBody(SSLTest_ECHPublicName_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  size_t extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *extraout_RDX_25;
  char *extraout_RDX_26;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *extraout_RDX_29;
  char *extraout_RDX_30;
  char *extraout_RDX_31;
  char *in_R9;
  string_view s;
  Span<const_unsigned_char> public_name;
  string_view s_00;
  Span<const_unsigned_char> public_name_00;
  string_view s_01;
  Span<const_unsigned_char> public_name_01;
  string_view s_02;
  Span<const_unsigned_char> public_name_02;
  string_view s_03;
  Span<const_unsigned_char> public_name_03;
  string_view s_04;
  Span<const_unsigned_char> public_name_04;
  string_view s_05;
  Span<const_unsigned_char> public_name_05;
  string_view s_06;
  Span<const_unsigned_char> public_name_06;
  string_view s_07;
  Span<const_unsigned_char> public_name_07;
  string_view s_08;
  Span<const_unsigned_char> public_name_08;
  Span<const_unsigned_char> public_name_09;
  string_view s_09;
  Span<const_unsigned_char> public_name_10;
  string_view s_10;
  Span<const_unsigned_char> public_name_11;
  string_view s_11;
  Span<const_unsigned_char> public_name_12;
  string_view s_12;
  Span<const_unsigned_char> public_name_13;
  string_view s_13;
  Span<const_unsigned_char> public_name_14;
  string_view s_14;
  Span<const_unsigned_char> public_name_15;
  string_view s_15;
  Span<const_unsigned_char> public_name_16;
  string_view s_16;
  Span<const_unsigned_char> public_name_17;
  string_view s_17;
  Span<const_unsigned_char> public_name_18;
  string_view s_18;
  Span<const_unsigned_char> public_name_19;
  string_view s_19;
  Span<const_unsigned_char> public_name_20;
  string_view s_20;
  Span<const_unsigned_char> public_name_21;
  string_view s_21;
  Span<const_unsigned_char> public_name_22;
  string_view s_22;
  Span<const_unsigned_char> public_name_23;
  string_view s_23;
  Span<const_unsigned_char> public_name_24;
  string_view s_24;
  Span<const_unsigned_char> public_name_25;
  string_view s_25;
  Span<const_unsigned_char> public_name_26;
  string_view s_26;
  Span<const_unsigned_char> public_name_27;
  string_view s_27;
  Span<const_unsigned_char> public_name_28;
  string_view s_28;
  Span<const_unsigned_char> public_name_29;
  string_view s_29;
  Span<const_unsigned_char> public_name_30;
  string_view s_30;
  Span<const_unsigned_char> public_name_31;
  string local_d78;
  AssertHelper local_d58;
  Message local_d50;
  basic_string_view<char,_std::char_traits<char>_> local_d48;
  Span<const_unsigned_char> local_d38;
  bool local_d21;
  undefined1 local_d20 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_cf0;
  Message local_ce8;
  basic_string_view<char,_std::char_traits<char>_> local_ce0;
  Span<const_unsigned_char> local_cd0;
  bool local_cb9;
  undefined1 local_cb8 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_c88;
  Message local_c80;
  basic_string_view<char,_std::char_traits<char>_> local_c78;
  Span<const_unsigned_char> local_c68;
  bool local_c51;
  undefined1 local_c50 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_c20;
  Message local_c18;
  basic_string_view<char,_std::char_traits<char>_> local_c10;
  Span<const_unsigned_char> local_c00;
  bool local_be9;
  undefined1 local_be8 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_bb8;
  Message local_bb0;
  basic_string_view<char,_std::char_traits<char>_> local_ba8;
  Span<const_unsigned_char> local_b98;
  bool local_b81;
  undefined1 local_b80 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_b50;
  Message local_b48;
  basic_string_view<char,_std::char_traits<char>_> local_b40;
  Span<const_unsigned_char> local_b30;
  bool local_b19;
  undefined1 local_b18 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_ae8;
  Message local_ae0;
  basic_string_view<char,_std::char_traits<char>_> local_ad8;
  Span<const_unsigned_char> local_ac8;
  bool local_ab1;
  undefined1 local_ab0 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_a80;
  Message local_a78;
  basic_string_view<char,_std::char_traits<char>_> local_a70;
  Span<const_unsigned_char> local_a60;
  bool local_a49;
  undefined1 local_a48 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_a18;
  Message local_a10;
  basic_string_view<char,_std::char_traits<char>_> local_a08;
  Span<const_unsigned_char> local_9f8;
  bool local_9e1;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_9b0;
  Message local_9a8;
  basic_string_view<char,_std::char_traits<char>_> local_9a0;
  Span<const_unsigned_char> local_990;
  bool local_979;
  undefined1 local_978 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_948;
  Message local_940;
  basic_string_view<char,_std::char_traits<char>_> local_938;
  Span<const_unsigned_char> local_928;
  bool local_911;
  undefined1 local_910 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_8e0;
  Message local_8d8;
  basic_string_view<char,_std::char_traits<char>_> local_8d0;
  Span<const_unsigned_char> local_8c0;
  bool local_8a9;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_878;
  Message local_870;
  basic_string_view<char,_std::char_traits<char>_> local_868;
  Span<const_unsigned_char> local_858;
  bool local_841;
  undefined1 local_840 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_810;
  Message local_808;
  basic_string_view<char,_std::char_traits<char>_> local_800;
  Span<const_unsigned_char> local_7f0;
  bool local_7d9;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_7a8;
  Message local_7a0;
  basic_string_view<char,_std::char_traits<char>_> local_798;
  Span<const_unsigned_char> local_788;
  bool local_771;
  undefined1 local_770 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_740;
  Message local_738;
  basic_string_view<char,_std::char_traits<char>_> local_730;
  Span<const_unsigned_char> local_720;
  bool local_709;
  undefined1 local_708 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_6d8;
  Message local_6d0;
  basic_string_view<char,_std::char_traits<char>_> local_6c8;
  Span<const_unsigned_char> local_6b8;
  bool local_6a1;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_670;
  Message local_668;
  basic_string_view<char,_std::char_traits<char>_> local_660;
  Span<const_unsigned_char> local_650;
  bool local_639;
  undefined1 local_638 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_608;
  Message local_600;
  basic_string_view<char,_std::char_traits<char>_> local_5f8;
  Span<const_unsigned_char> local_5e8;
  bool local_5d1;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_5a0;
  Message local_598;
  basic_string_view<char,_std::char_traits<char>_> local_590;
  Span<const_unsigned_char> local_580;
  bool local_569;
  undefined1 local_568 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_538;
  Message local_530;
  basic_string_view<char,_std::char_traits<char>_> local_528;
  Span<const_unsigned_char> local_518;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_4d0;
  Message local_4c8;
  basic_string_view<char,_std::char_traits<char>_> local_4c0;
  Span<const_unsigned_char> local_4b0;
  bool local_499;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_468;
  Message local_460;
  bssl *local_458;
  uchar *local_450;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_410;
  Message local_408;
  basic_string_view<char,_std::char_traits<char>_> local_400;
  Span<const_unsigned_char> local_3f0;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_3a8;
  Message local_3a0;
  basic_string_view<char,_std::char_traits<char>_> local_398;
  Span<const_unsigned_char> local_388;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_340;
  Message local_338;
  basic_string_view<char,_std::char_traits<char>_> local_330;
  Span<const_unsigned_char> local_320;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2d8;
  Message local_2d0;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  Span<const_unsigned_char> local_2b8;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_270;
  Message local_268;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  Span<const_unsigned_char> local_250;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_208;
  Message local_200;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  Span<const_unsigned_char> local_1e8;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1a0;
  Message local_198;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  Span<const_unsigned_char> local_180;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_138;
  Message local_130;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  Span<const_unsigned_char> local_118;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_d0;
  Message local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  Span<const_unsigned_char> local_b0;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_68 [3];
  Message local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  Span<const_unsigned_char> local_38;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  SSLTest_ECHPublicName_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"");
  s._M_str = extraout_RDX;
  s._M_len = (size_t)local_48._M_str;
  local_38 = StringAsBytes((bssl *)local_48._M_len,s);
  public_name.size_ = (uchar *)local_38.size_;
  public_name.data_ = public_name.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_38.data_,public_name);
  local_21 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"\"))","true","false"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8d7,pcVar2);
    testing::internal::AssertHelper::operator=(local_68,&local_50);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"example.com");
  s_00._M_str = extraout_RDX_00;
  s_00._M_len = (size_t)local_c0._M_str;
  local_b0 = StringAsBytes((bssl *)local_c0._M_len,s_00);
  public_name_00.size_ = (uchar *)local_b0.size_;
  public_name_00.data_ = public_name_00.size_;
  local_99 = ssl_is_valid_ech_public_name((bssl *)local_b0.data_,public_name_00);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_98,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"example.com\"))",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8d8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,".example.com");
  s_01._M_str = extraout_RDX_01;
  s_01._M_len = (size_t)local_128._M_str;
  local_118 = StringAsBytes((bssl *)local_128._M_len,s_01);
  public_name_01.size_ = (uchar *)local_118.size_;
  public_name_01.data_ = public_name_01.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_118.data_,public_name_01);
  local_101 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_100,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\".example.com\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8d9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,"example.com.");
  s_02._M_str = extraout_RDX_02;
  s_02._M_len = (size_t)local_190._M_str;
  local_180 = StringAsBytes((bssl *)local_190._M_len,s_02);
  public_name_02.size_ = (uchar *)local_180.size_;
  public_name_02.data_ = public_name_02.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_180.data_,public_name_02);
  local_169 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_168,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"example.com.\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8da,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f8,"example..com");
  s_03._M_str = extraout_RDX_03;
  s_03._M_len = (size_t)local_1f8._M_str;
  local_1e8 = StringAsBytes((bssl *)local_1f8._M_len,s_03);
  public_name_03.size_ = (uchar *)local_1e8.size_;
  public_name_03.data_ = public_name_03.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_1e8.data_,public_name_03);
  local_1d1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1d0,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"example..com\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8db,pcVar2);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_260,"www.-example.com");
  s_04._M_str = extraout_RDX_04;
  s_04._M_len = (size_t)local_260._M_str;
  local_250 = StringAsBytes((bssl *)local_260._M_len,s_04);
  public_name_04.size_ = (uchar *)local_250.size_;
  public_name_04.data_ = public_name_04.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_250.data_,public_name_04);
  local_239 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_238,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name(StringAsBytes(\"www.-example.com\"))","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8dc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2c8,"www.example-.com");
  s_05._M_str = extraout_RDX_05;
  s_05._M_len = (size_t)local_2c8._M_str;
  local_2b8 = StringAsBytes((bssl *)local_2c8._M_len,s_05);
  public_name_05.size_ = (uchar *)local_2b8.size_;
  public_name_05.data_ = public_name_05.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_2b8.data_,public_name_05);
  local_2a1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_2a0,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name(StringAsBytes(\"www.example-.com\"))","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8dd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_330,"no_underscores.example");
  s_06._M_str = extraout_RDX_06;
  s_06._M_len = (size_t)local_330._M_str;
  local_320 = StringAsBytes((bssl *)local_330._M_len,s_06);
  public_name_06.size_ = (uchar *)local_320.size_;
  public_name_06.data_ = public_name_06.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_320.data_,public_name_06);
  local_309 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_308,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name(StringAsBytes(\"no_underscores.example\"))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8df,pcVar2);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_398,"invalid_chars.\x01.example");
  s_07._M_str = extraout_RDX_07;
  s_07._M_len = (size_t)local_398._M_str;
  local_388 = StringAsBytes((bssl *)local_398._M_len,s_07);
  public_name_07.size_ = (uchar *)local_388.size_;
  public_name_07.data_ = public_name_07.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_388.data_,public_name_07);
  local_371 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_370,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name( StringAsBytes(\"invalid_chars.\\x01.example\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8e1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_400,anon_var_dwarf_8e1f6);
  s_08._M_str = extraout_RDX_08;
  s_08._M_len = (size_t)local_400._M_str;
  local_3f0 = StringAsBytes((bssl *)local_400._M_len,s_08);
  public_name_08.size_ = (uchar *)local_3f0.size_;
  public_name_08.data_ = public_name_08.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_3f0.data_,public_name_08);
  local_3d9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_3d8,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name( StringAsBytes(\"invalid_chars.\\xff.example\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8e3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  Span<unsigned_char_const>::Span<5ul>
            ((Span<unsigned_char_const> *)&local_458,(uchar (*) [5])"test");
  public_name_09.size_ = extraout_RDX_09;
  public_name_09.data_ = local_450;
  bVar1 = ssl_is_valid_ech_public_name(local_458,public_name_09);
  local_441 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,&local_441,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_440,
               (AssertionResult *)"ssl_is_valid_ech_public_name(kWithNUL)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8e5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_4c0,"abcdefhijklmnopqrstuvwxyz-ABCDEFGHIJKLMNOPQRSTUVWXYZ-0123456789");
  s_09._M_str = extraout_RDX_10;
  s_09._M_len = (size_t)local_4c0._M_str;
  local_4b0 = StringAsBytes((bssl *)local_4c0._M_len,s_09);
  public_name_10.size_ = (uchar *)local_4b0.size_;
  public_name_10.data_ = public_name_10.size_;
  local_499 = ssl_is_valid_ech_public_name((bssl *)local_4b0.data_,public_name_10);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_498,&local_499,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_498,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name(StringAsBytes( \"abcdefhijklmnopqrstuvwxyz-ABCDEFGHIJKLMNOPQRSTUVWXYZ-0123456789\"))"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8e9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_528,"abcdefhijklmnopqrstuvwxyz-ABCDEFGHIJKLMNOPQRSTUVWXYZ-01234567899");
  s_10._M_str = extraout_RDX_11;
  s_10._M_len = (size_t)local_528._M_str;
  local_518 = StringAsBytes((bssl *)local_528._M_len,s_10);
  public_name_11.size_ = (uchar *)local_518.size_;
  public_name_11.data_ = public_name_11.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_518.data_,public_name_11);
  local_501 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_500,&local_501,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_500,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name(StringAsBytes( \"abcdefhijklmnopqrstuvwxyz-ABCDEFGHIJKLMNOPQRSTUVWXYZ-01234567899\"))"
               ,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8eb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_538,&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_590,"127.0.0.1");
  s_11._M_str = extraout_RDX_12;
  s_11._M_len = (size_t)local_590._M_str;
  local_580 = StringAsBytes((bssl *)local_590._M_len,s_11);
  public_name_12.size_ = (uchar *)local_580.size_;
  public_name_12.data_ = public_name_12.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_580.data_,public_name_12);
  local_569 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_568,&local_569,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_568,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"127.0.0.1\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8ee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5f8,"example.1");
  s_12._M_str = extraout_RDX_13;
  s_12._M_len = (size_t)local_5f8._M_str;
  local_5e8 = StringAsBytes((bssl *)local_5f8._M_len,s_12);
  public_name_13.size_ = (uchar *)local_5e8.size_;
  public_name_13.data_ = public_name_13.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_5e8.data_,public_name_13);
  local_5d1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d0,&local_5d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_5d0,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"example.1\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8ef,pcVar2);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_660,"example.01");
  s_13._M_str = extraout_RDX_14;
  s_13._M_len = (size_t)local_660._M_str;
  local_650 = StringAsBytes((bssl *)local_660._M_len,s_13);
  public_name_14.size_ = (uchar *)local_650.size_;
  public_name_14.data_ = public_name_14.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_650.data_,public_name_14);
  local_639 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_638,&local_639,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(&local_668);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_638,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"example.01\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8f0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_670,&local_668);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6c8,"example.0x01");
  s_14._M_str = extraout_RDX_15;
  s_14._M_len = (size_t)local_6c8._M_str;
  local_6b8 = StringAsBytes((bssl *)local_6c8._M_len,s_14);
  public_name_15.size_ = (uchar *)local_6b8.size_;
  public_name_15.data_ = public_name_15.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_6b8.data_,public_name_15);
  local_6a1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6a0,&local_6a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_6a0,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"example.0x01\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8f1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_730,"example.0X01");
  s_15._M_str = extraout_RDX_16;
  s_15._M_len = (size_t)local_730._M_str;
  local_720 = StringAsBytes((bssl *)local_730._M_len,s_15);
  public_name_16.size_ = (uchar *)local_720.size_;
  public_name_16.data_ = public_name_16.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_720.data_,public_name_16);
  local_709 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_708,&local_709,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_708,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"example.0X01\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8f2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_740,&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_798,"example.123456789000000000000000");
  s_16._M_str = extraout_RDX_17;
  s_16._M_len = (size_t)local_798._M_str;
  local_788 = StringAsBytes((bssl *)local_798._M_len,s_16);
  public_name_17.size_ = (uchar *)local_788.size_;
  public_name_17.data_ = public_name_17.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_788.data_,public_name_17);
  local_771 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_770,&local_771,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_7a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_770,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name( StringAsBytes(\"example.123456789000000000000000\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8f5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_800,"example.012345678900000000000000");
  s_17._M_str = extraout_RDX_18;
  s_17._M_len = (size_t)local_800._M_str;
  local_7f0 = StringAsBytes((bssl *)local_800._M_len,s_17);
  public_name_18.size_ = (uchar *)local_7f0.size_;
  public_name_18.data_ = public_name_18.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_7f0.data_,public_name_18);
  local_7d9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7d8,&local_7d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_7d8,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name( StringAsBytes(\"example.012345678900000000000000\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8f7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_810,&local_808);
    testing::internal::AssertHelper::~AssertHelper(&local_810);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_868,"example.0x123456789abcdefABCDEF0");
  s_18._M_str = extraout_RDX_19;
  s_18._M_len = (size_t)local_868._M_str;
  local_858 = StringAsBytes((bssl *)local_868._M_len,s_18);
  public_name_19.size_ = (uchar *)local_858.size_;
  public_name_19.data_ = public_name_19.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_858.data_,public_name_19);
  local_841 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_840,&local_841,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_870);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_840,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name( StringAsBytes(\"example.0x123456789abcdefABCDEF0\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8f9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_878,&local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_8d0,"example.0x0123456789abcdefABCDEF");
  s_19._M_str = extraout_RDX_20;
  s_19._M_len = (size_t)local_8d0._M_str;
  local_8c0 = StringAsBytes((bssl *)local_8d0._M_len,s_19);
  public_name_20.size_ = (uchar *)local_8c0.size_;
  public_name_20.data_ = public_name_20.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_8c0.data_,public_name_20);
  local_8a9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a8,&local_8a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_8a8,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name( StringAsBytes(\"example.0x0123456789abcdefABCDEF\"))",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8fb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8e0,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper(&local_8e0);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_938,"example.1234567890a");
  s_20._M_str = extraout_RDX_21;
  s_20._M_len = (size_t)local_938._M_str;
  local_928 = StringAsBytes((bssl *)local_938._M_len,s_20);
  public_name_21.size_ = (uchar *)local_928.size_;
  public_name_21.data_ = public_name_21.size_;
  local_911 = ssl_is_valid_ech_public_name((bssl *)local_928.data_,public_name_21);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_910,&local_911,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar1) {
    testing::Message::Message(&local_940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_910,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name(StringAsBytes(\"example.1234567890a\"))","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8ff,pcVar2);
    testing::internal::AssertHelper::operator=(&local_948,&local_940);
    testing::internal::AssertHelper::~AssertHelper(&local_948);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_9a0,"example.01234567890a");
  s_21._M_str = extraout_RDX_22;
  s_21._M_len = (size_t)local_9a0._M_str;
  local_990 = StringAsBytes((bssl *)local_9a0._M_len,s_21);
  public_name_22.size_ = (uchar *)local_990.size_;
  public_name_22.data_ = public_name_22.size_;
  local_979 = ssl_is_valid_ech_public_name((bssl *)local_990.data_,public_name_22);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_978,&local_979,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
  if (!bVar1) {
    testing::Message::Message(&local_9a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_978,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name(StringAsBytes(\"example.01234567890a\"))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x901,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9b0,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9b0);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a08,"example.0x123456789abcdefg");
  s_22._M_str = extraout_RDX_23;
  s_22._M_len = (size_t)local_a08._M_str;
  local_9f8 = StringAsBytes((bssl *)local_a08._M_len,s_22);
  public_name_23.size_ = (uchar *)local_9f8.size_;
  public_name_23.data_ = public_name_23.size_;
  local_9e1 = ssl_is_valid_ech_public_name((bssl *)local_9f8.data_,public_name_23);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9e0,&local_9e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
  if (!bVar1) {
    testing::Message::Message(&local_a10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_9e0,
               (AssertionResult *)
               "ssl_is_valid_ech_public_name( StringAsBytes(\"example.0x123456789abcdefg\"))",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x903,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a18,&local_a10);
    testing::internal::AssertHelper::~AssertHelper(&local_a18);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_a10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a70,"1");
  s_23._M_str = extraout_RDX_24;
  s_23._M_len = (size_t)local_a70._M_str;
  local_a60 = StringAsBytes((bssl *)local_a70._M_len,s_23);
  public_name_24.size_ = (uchar *)local_a60.size_;
  public_name_24.data_ = public_name_24.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_a60.data_,public_name_24);
  local_a49 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a48,&local_a49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a48);
  if (!bVar1) {
    testing::Message::Message(&local_a78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_a48,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"1\"))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x904,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a80,&local_a78);
    testing::internal::AssertHelper::~AssertHelper(&local_a80);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a48);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_ad8,"01");
  s_24._M_str = extraout_RDX_25;
  s_24._M_len = (size_t)local_ad8._M_str;
  local_ac8 = StringAsBytes((bssl *)local_ad8._M_len,s_24);
  public_name_25.size_ = (uchar *)local_ac8.size_;
  public_name_25.data_ = public_name_25.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_ac8.data_,public_name_25);
  local_ab1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ab0,&local_ab1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab0);
  if (!bVar1) {
    testing::Message::Message(&local_ae0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_ab0,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"01\"))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ae8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x905,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ae8,&local_ae0);
    testing::internal::AssertHelper::~AssertHelper(&local_ae8);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_ae0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b40,"0x01");
  s_25._M_str = extraout_RDX_26;
  s_25._M_len = (size_t)local_b40._M_str;
  local_b30 = StringAsBytes((bssl *)local_b40._M_len,s_25);
  public_name_26.size_ = (uchar *)local_b30.size_;
  public_name_26.data_ = public_name_26.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_b30.data_,public_name_26);
  local_b19 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b18,&local_b19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
  if (!bVar1) {
    testing::Message::Message(&local_b48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_b18,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"0x01\"))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x906,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b50,&local_b48);
    testing::internal::AssertHelper::~AssertHelper(&local_b50);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_ba8,"0X01");
  s_26._M_str = extraout_RDX_27;
  s_26._M_len = (size_t)local_ba8._M_str;
  local_b98 = StringAsBytes((bssl *)local_ba8._M_len,s_26);
  public_name_27.size_ = (uchar *)local_b98.size_;
  public_name_27.data_ = public_name_27.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_b98.data_,public_name_27);
  local_b81 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b80,&local_b81,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b80);
  if (!bVar1) {
    testing::Message::Message(&local_bb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__29.message_,(internal *)local_b80,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"0X01\"))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x907,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bb8,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_bb8);
    std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c10,"1.");
  s_27._M_str = extraout_RDX_28;
  s_27._M_len = (size_t)local_c10._M_str;
  local_c00 = StringAsBytes((bssl *)local_c10._M_len,s_27);
  public_name_28.size_ = (uchar *)local_c00.size_;
  public_name_28.data_ = public_name_28.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_c00.data_,public_name_28);
  local_be9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_be8,&local_be9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be8);
  if (!bVar1) {
    testing::Message::Message(&local_c18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_be8,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"1.\"))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x90a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c20,&local_c18);
    testing::internal::AssertHelper::~AssertHelper(&local_c20);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_c18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c78,"01.");
  s_28._M_str = extraout_RDX_29;
  s_28._M_len = (size_t)local_c78._M_str;
  local_c68 = StringAsBytes((bssl *)local_c78._M_len,s_28);
  public_name_29.size_ = (uchar *)local_c68.size_;
  public_name_29.data_ = public_name_29.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_c68.data_,public_name_29);
  local_c51 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c50,&local_c51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c50);
  if (!bVar1) {
    testing::Message::Message(&local_c80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__31.message_,(internal *)local_c50,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"01.\"))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x90b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c88,&local_c80);
    testing::internal::AssertHelper::~AssertHelper(&local_c88);
    std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_c80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_ce0,"0x01.");
  s_29._M_str = extraout_RDX_30;
  s_29._M_len = (size_t)local_ce0._M_str;
  local_cd0 = StringAsBytes((bssl *)local_ce0._M_len,s_29);
  public_name_30.size_ = (uchar *)local_cd0.size_;
  public_name_30.data_ = public_name_30.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_cd0.data_,public_name_30);
  local_cb9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cb8,&local_cb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb8);
  if (!bVar1) {
    testing::Message::Message(&local_ce8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__32.message_,(internal *)local_cb8,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"0x01.\"))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x90c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cf0,&local_ce8);
    testing::internal::AssertHelper::~AssertHelper(&local_cf0);
    std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
    testing::Message::~Message(&local_ce8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d48,"0X01.");
  s_30._M_str = extraout_RDX_31;
  s_30._M_len = (size_t)local_d48._M_str;
  local_d38 = StringAsBytes((bssl *)local_d48._M_len,s_30);
  public_name_31.size_ = (uchar *)local_d38.size_;
  public_name_31.data_ = public_name_31.size_;
  bVar1 = ssl_is_valid_ech_public_name((bssl *)local_d38.data_,public_name_31);
  local_d21 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d20,&local_d21,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d20);
  if (!bVar1) {
    testing::Message::Message(&local_d50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d78,(internal *)local_d20,
               (AssertionResult *)"ssl_is_valid_ech_public_name(StringAsBytes(\"0X01.\"))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x90d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d58,&local_d50);
    testing::internal::AssertHelper::~AssertHelper(&local_d58);
    std::__cxx11::string::~string((string *)&local_d78);
    testing::Message::~Message(&local_d50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d20);
  return;
}

Assistant:

TEST(SSLTest, ECHPublicName) {
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("")));
  EXPECT_TRUE(ssl_is_valid_ech_public_name(StringAsBytes("example.com")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes(".example.com")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("example.com.")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("example..com")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("www.-example.com")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("www.example-.com")));
  EXPECT_FALSE(
      ssl_is_valid_ech_public_name(StringAsBytes("no_underscores.example")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(
      StringAsBytes("invalid_chars.\x01.example")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(
      StringAsBytes("invalid_chars.\xff.example")));
  static const uint8_t kWithNUL[] = {'t', 'e', 's', 't', 0};
  EXPECT_FALSE(ssl_is_valid_ech_public_name(kWithNUL));

  // Test an LDH label with every character and the maximum length.
  EXPECT_TRUE(ssl_is_valid_ech_public_name(StringAsBytes(
      "abcdefhijklmnopqrstuvwxyz-ABCDEFGHIJKLMNOPQRSTUVWXYZ-0123456789")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes(
      "abcdefhijklmnopqrstuvwxyz-ABCDEFGHIJKLMNOPQRSTUVWXYZ-01234567899")));

  // Inputs with trailing numeric components are rejected.
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("127.0.0.1")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("example.1")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("example.01")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("example.0x01")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("example.0X01")));
  // Leading zeros and values that overflow |uint32_t| are still rejected.
  EXPECT_FALSE(ssl_is_valid_ech_public_name(
      StringAsBytes("example.123456789000000000000000")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(
      StringAsBytes("example.012345678900000000000000")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(
      StringAsBytes("example.0x123456789abcdefABCDEF0")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(
      StringAsBytes("example.0x0123456789abcdefABCDEF")));
  // Adding a non-digit or non-hex character makes it a valid DNS name again.
  // Single-component numbers are rejected.
  EXPECT_TRUE(
      ssl_is_valid_ech_public_name(StringAsBytes("example.1234567890a")));
  EXPECT_TRUE(
      ssl_is_valid_ech_public_name(StringAsBytes("example.01234567890a")));
  EXPECT_TRUE(ssl_is_valid_ech_public_name(
      StringAsBytes("example.0x123456789abcdefg")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("1")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("01")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("0x01")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("0X01")));
  // Numbers with trailing dots are rejected. (They are already rejected by the
  // LDH label rules, but the WHATWG URL parser additionally rejects them.)
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("1.")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("01.")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("0x01.")));
  EXPECT_FALSE(ssl_is_valid_ech_public_name(StringAsBytes("0X01.")));
}